

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocketnotifier.cpp
# Opt level: O2

int __thiscall QSocketNotifier::qt_metacall(QSocketNotifier *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  Call _c_00;
  
  _id_00 = QObject::qt_metacall(&this->super_QObject,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (3 < _id_00) goto LAB_0029e5f0;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (3 < _id_00) goto LAB_0029e5f0;
    _c_00 = InvokeMetaMethod;
  }
  qt_static_metacall(&this->super_QObject,_c_00,_id_00,_a);
LAB_0029e5f0:
  return _id_00 - 4;
}

Assistant:

int QSocketNotifier::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}